

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalBGValueFunctionVector.cpp
# Opt level: O1

void __thiscall
LocalBGValueFunctionVector::~LocalBGValueFunctionVector(LocalBGValueFunctionVector *this)

{
  pointer puVar1;
  pointer pdVar2;
  pointer puVar3;
  
  (this->super_LocalBGValueFunctionInterface)._vptr_LocalBGValueFunctionInterface =
       (_func_int **)&PTR__LocalBGValueFunctionVector_005a1ae8;
  puVar1 = (this->_m_nrIndivPols).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->_m_nrIndivPols).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  pdVar2 = (this->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->_m_values).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  boost::detail::shared_count::~shared_count(&(this->_m_bgcg).pn);
  puVar3 = (this->_m_agentScope).super_SDT.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->_m_agentScope).super_SDT.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
    return;
  }
  return;
}

Assistant:

LocalBGValueFunctionVector::~LocalBGValueFunctionVector()
{
}